

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O3

void __thiscall
amrex::YAFluxRegister::FineAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *a_flux,Real *dx,
          Real dt,RunOn runon)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint N;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pVVar8;
  double dVar9;
  undefined1 auVar10 [16];
  Box bx_00;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  pointer ppFVar16;
  int iVar17;
  uint uVar18;
  int *piVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  ulong uVar30;
  double *pdVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  int iVar36;
  BaseFab<double> *pBVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  double *pdVar41;
  long lVar42;
  double *pdVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int idim;
  uint uVar51;
  int iVar52;
  int iVar53;
  ulong uVar54;
  int iVar55;
  uint uVar56;
  double dVar57;
  undefined1 auVar58 [16];
  IntVect hi;
  Box result;
  Box bx;
  array<amrex::FArrayBox,_3UL> ftmp;
  undefined1 auVar59 [12];
  uint local_30c;
  undefined8 local_288;
  uint local_280;
  uint local_278;
  uint uStack_274;
  uint local_270;
  uint local_26c [7];
  long local_250;
  double *local_248;
  Box local_240;
  uint local_224;
  uint local_220;
  int local_21c;
  uint local_218;
  int local_214;
  long local_210;
  long local_208;
  long local_200;
  double *local_1f8;
  double *local_1f0;
  long local_1e8;
  long local_1e0;
  double *local_1d8;
  uint local_1d0;
  int local_1cc;
  uint local_1c8;
  int local_1c4;
  int local_1c0;
  uint local_1bc;
  int local_1b8;
  int local_1b4;
  pointer local_1b0;
  FArrayBox *local_1a8;
  pointer local_1a0;
  FArrayBox *local_198;
  Box local_18c;
  ulong local_170;
  pointer local_168;
  double *local_160;
  ulong local_158;
  uint local_150;
  FArrayBox *local_148 [4];
  undefined1 local_128 [16];
  double local_118;
  BaseFab<double> local_108 [3];
  
  piVar19 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar19 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar19;
  }
  iVar17 = *piVar19;
  pVVar8 = (this->m_cfp_fab).
           super_vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       &pVVar8[iVar17].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
        super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> ==
      *(pointer *)
       ((long)&pVVar8[iVar17].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> + 8)) {
    return;
  }
  MFIter::tilebox(&local_18c,mfi);
  uStack_274 = local_18c.smallend.vect[1];
  local_278 = local_18c.smallend.vect[0];
  local_26c[1] = local_18c.bigend.vect[1];
  local_26c[2] = local_18c.bigend.vect[2];
  local_270 = local_18c.smallend.vect[2];
  local_26c[0] = local_18c.bigend.vect[0];
  uVar2 = (this->m_ratio).vect[0];
  uVar54 = (ulong)uVar2;
  uVar3 = (this->m_ratio).vect[1];
  uVar44 = (ulong)uVar3;
  uVar47 = local_18c.smallend.vect[1];
  local_224 = local_18c.btype.itype;
  if (uVar3 == 1 && uVar2 == 1) {
    if ((this->m_ratio).vect[2] == 1) {
      uVar51 = 1;
      goto LAB_0072c141;
    }
  }
  else {
    if (uVar54 != 1) {
      if (uVar2 == 4) {
        if (local_18c.smallend.vect[0] < 0) {
          local_278 = local_18c.smallend.vect[0] >> 2;
        }
        else {
          local_278 = (uint)local_18c.smallend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        if (local_18c.smallend.vect[0] < 0) {
          local_278 = local_18c.smallend.vect[0] >> 1;
        }
        else {
          local_278 = (uint)local_18c.smallend.vect[0] >> 1;
        }
      }
      else if (local_18c.smallend.vect[0] < 0) {
        local_278 = ~(~local_18c.smallend.vect[0] / (int)uVar2);
      }
      else {
        local_278 = local_18c.smallend.vect[0] / (int)uVar2;
      }
    }
    if (uVar44 != 1) {
      if (uVar3 == 4) {
        if (local_18c.smallend.vect[1] < 0) {
          uVar47 = local_18c.smallend.vect[1] >> 2;
        }
        else {
          uVar47 = (uint)local_18c.smallend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        if (local_18c.smallend.vect[1] < 0) {
          uVar47 = local_18c.smallend.vect[1] >> 1;
        }
        else {
          uVar47 = (uint)local_18c.smallend.vect[1] >> 1;
        }
      }
      else if (local_18c.smallend.vect[1] < 0) {
        uVar47 = ~(~local_18c.smallend.vect[1] / (int)uVar3);
      }
      else {
        uVar47 = local_18c.smallend.vect[1] / (int)uVar3;
      }
    }
  }
  uStack_274 = uVar47;
  uVar51 = (this->m_ratio).vect[2];
  if (uVar51 != 1) {
    if (uVar51 == 4) {
      if (local_18c.smallend.vect[2] < 0) {
        local_270 = local_18c.smallend.vect[2] >> 2;
      }
      else {
        local_270 = (uint)local_18c.smallend.vect[2] >> 2;
      }
    }
    else if (uVar51 == 2) {
      if (local_18c.smallend.vect[2] < 0) {
        local_270 = local_18c.smallend.vect[2] >> 1;
      }
      else {
        local_270 = (uint)local_18c.smallend.vect[2] >> 1;
      }
    }
    else if (local_18c.smallend.vect[2] < 0) {
      local_270 = ~(~local_18c.smallend.vect[2] / (int)uVar51);
    }
    else {
      local_270 = local_18c.smallend.vect[2] / (int)uVar51;
    }
  }
  if (local_18c.btype.itype == 0) {
    if (uVar54 != 1) {
      if (uVar2 == 4) {
        local_26c[0] = local_18c.bigend.vect[0] >> 2;
        if (-1 < local_18c.bigend.vect[0]) {
          local_26c[0] = (uint)local_18c.bigend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        local_26c[0] = local_18c.bigend.vect[0] >> 1;
        if (-1 < local_18c.bigend.vect[0]) {
          local_26c[0] = (uint)local_18c.bigend.vect[0] >> 1;
        }
      }
      else if (local_18c.bigend.vect[0] < 0) {
        local_26c[0] = ~(~local_18c.bigend.vect[0] / (int)uVar2);
      }
      else {
        local_26c[0] = local_18c.bigend.vect[0] / (int)uVar2;
      }
    }
    if (uVar44 != 1) {
      if (uVar3 == 4) {
        local_26c[1] = local_18c.bigend.vect[1] >> 2;
        if (-1 < local_18c.bigend.vect[1]) {
          local_26c[1] = (uint)local_18c.bigend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        local_26c[1] = local_18c.bigend.vect[1] >> 1;
        if (-1 < local_18c.bigend.vect[1]) {
          local_26c[1] = (uint)local_18c.bigend.vect[1] >> 1;
        }
      }
      else if (local_18c.bigend.vect[1] < 0) {
        local_26c[1] = ~(~local_18c.bigend.vect[1] / (int)uVar3);
      }
      else {
        local_26c[1] = local_18c.bigend.vect[1] / (int)uVar3;
      }
    }
    if (uVar51 != 1) {
      if (uVar51 == 4) {
        local_26c[2] = local_18c.bigend.vect[2] >> 2;
        if (-1 < local_18c.bigend.vect[2]) {
          local_26c[2] = (uint)local_18c.bigend.vect[2] >> 2;
        }
      }
      else if (uVar51 == 2) {
        local_26c[2] = local_18c.bigend.vect[2] >> 1;
        if (-1 < local_18c.bigend.vect[2]) {
          local_26c[2] = (uint)local_18c.bigend.vect[2] >> 1;
        }
      }
      else if (local_18c.bigend.vect[2] < 0) {
        local_26c[2] = ~(~local_18c.bigend.vect[2] / (int)uVar51);
      }
      else {
        local_26c[2] = local_18c.bigend.vect[2] / (int)uVar51;
      }
    }
    local_224 = 0;
  }
  else {
    local_108[0]._vptr_BaseFab = (_func_int **)0x0;
    local_108[0].super_DataAllocator.m_arena._0_4_ = 0;
    lVar39 = 0;
    do {
      if (((local_18c.btype.itype >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
         ((int)local_26c[lVar39] % (this->m_ratio).vect[lVar39] != 0)) {
        *(undefined4 *)((long)(&local_108[0].domain.smallend + -2) + lVar39 * 4) = 1;
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 != 3);
    if (uVar54 != 1) {
      if (uVar2 == 4) {
        local_26c[0] = local_18c.bigend.vect[0] >> 2;
        if (-1 < local_18c.bigend.vect[0]) {
          local_26c[0] = (uint)local_18c.bigend.vect[0] >> 2;
        }
      }
      else if (uVar2 == 2) {
        local_26c[0] = local_18c.bigend.vect[0] >> 1;
        if (-1 < local_18c.bigend.vect[0]) {
          local_26c[0] = (uint)local_18c.bigend.vect[0] >> 1;
        }
      }
      else if (local_18c.bigend.vect[0] < 0) {
        local_26c[0] = ~(~local_18c.bigend.vect[0] / (int)uVar2);
      }
      else {
        local_26c[0] = local_18c.bigend.vect[0] / (int)uVar2;
      }
    }
    if (uVar44 != 1) {
      if (uVar3 == 4) {
        local_26c[1] = local_18c.bigend.vect[1] >> 2;
        if (-1 < local_18c.bigend.vect[1]) {
          local_26c[1] = (uint)local_18c.bigend.vect[1] >> 2;
        }
      }
      else if (uVar3 == 2) {
        local_26c[1] = local_18c.bigend.vect[1] >> 1;
        if (-1 < local_18c.bigend.vect[1]) {
          local_26c[1] = (uint)local_18c.bigend.vect[1] >> 1;
        }
      }
      else if (local_18c.bigend.vect[1] < 0) {
        local_26c[1] = ~(~local_18c.bigend.vect[1] / (int)uVar3);
      }
      else {
        local_26c[1] = local_18c.bigend.vect[1] / (int)uVar3;
      }
    }
    if (uVar51 != 1) {
      if (uVar51 == 4) {
        local_26c[2] = local_18c.bigend.vect[2] >> 2;
        if (-1 < local_18c.bigend.vect[2]) {
          local_26c[2] = (uint)local_18c.bigend.vect[2] >> 2;
        }
      }
      else if (uVar51 == 2) {
        local_26c[2] = local_18c.bigend.vect[2] >> 1;
        if (-1 < local_18c.bigend.vect[2]) {
          local_26c[2] = (uint)local_18c.bigend.vect[2] >> 1;
        }
      }
      else if (local_18c.bigend.vect[2] < 0) {
        local_26c[2] = ~(~local_18c.bigend.vect[2] / (int)uVar51);
      }
      else {
        local_26c[2] = local_18c.bigend.vect[2] / (int)uVar51;
      }
    }
    local_26c[0] = local_26c[0] + (int)local_108[0]._vptr_BaseFab;
    local_26c[1] = local_26c[1] + local_108[0]._vptr_BaseFab._4_4_;
    local_26c[2] = local_26c[2] + (int)local_108[0].super_DataAllocator.m_arena;
  }
LAB_0072c141:
  local_30c = local_270;
  uVar18 = local_26c[1];
  uVar4 = local_26c[0];
  uVar56 = local_278;
  uVar32 = local_26c[2];
  if (!(bool)(~(uVar3 != 1 || uVar2 != 1) & uVar51 == 1)) {
    uVar47 = uVar47 * uVar3;
    local_30c = local_270 * uVar51;
    uVar18 = (uint)((local_224 & 2) == 0);
    uVar32 = (uint)((local_224 & 4) == 0);
    uVar18 = (local_26c[1] + uVar18) * uVar3 - uVar18;
    uVar4 = (local_26c[0] + (~local_224 & 1)) * uVar2 - (~local_224 & 1);
    uVar56 = local_278 * uVar2;
    uVar32 = (local_26c[2] + uVar32) * uVar51 - uVar32;
  }
  N = (this->m_cfpatch).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
  uVar20 = (ulong)N;
  dVar9 = (double)(int)(uVar3 * uVar2 * uVar51);
  auVar58._8_8_ = dt;
  auVar58._0_8_ = dt;
  auVar10._8_8_ = dVar9 * dx[1];
  auVar10._0_8_ = dVar9 * *dx;
  local_128 = divpd(auVar58,auVar10);
  local_118 = dt / (dVar9 * dx[2]);
  local_148[0] = a_flux->_M_elems[0];
  local_148[1] = a_flux->_M_elems[1];
  local_148[2] = a_flux->_M_elems[2];
  lVar39 = 0;
  do {
    FArrayBox::FArrayBox((FArrayBox *)((long)(&local_108[0].domain.smallend + -2) + lVar39));
    uVar15 = local_224;
    lVar39 = lVar39 + 0x48;
  } while (lVar39 != 0xd8);
  if ((((uVar56 != local_18c.smallend.vect[0]) || (uVar47 != local_18c.smallend.vect[1])) ||
      (local_30c != local_18c.smallend.vect[2])) ||
     (((uVar4 != local_18c.bigend.vect[0] || (uVar18 != local_18c.bigend.vect[1])) ||
      ((uVar32 != local_18c.bigend.vect[2] || (local_224 != local_18c.btype.itype)))))) {
    pBVar37 = local_108;
    lVar39 = 0;
    do {
      local_240.smallend.vect[1] = uVar47;
      local_240.smallend.vect[0] = uVar56;
      local_240.smallend.vect[2] = local_30c;
      local_240.bigend.vect[0] = uVar4;
      local_240.bigend.vect[1] = uVar18;
      local_240.bigend.vect[2] = uVar32;
      local_240.btype.itype = uVar15;
      if ((uVar15 >> ((uint)lVar39 & 0x1f) & 1) == 0) {
        piVar19 = local_240.bigend.vect + lVar39;
        *piVar19 = *piVar19 + 1;
        local_240.btype.itype = uVar15 | 1 << ((byte)lVar39 & 0x1f);
      }
      FArrayBox::resize((FArrayBox *)pBVar37,&local_240,N,(Arena *)0x0);
      local_288 = 0.0;
      BaseFab<double>::setVal<(amrex::RunOn)1>
                (pBVar37,(double *)&local_288,&pBVar37->domain,(DestComp)0x0,(NumComps)pBVar37->nvar
                );
      auVar1._0_12_ = *(undefined1 (*) [12])&(pBVar37->domain).bigend;
      auVar1._12_4_ = (pBVar37->domain).btype;
      auVar59 = auVar1._4_12_;
      bx_00.bigend.vect[0] =
           (int)((ulong)*(undefined8 *)((pBVar37->domain).smallend.vect + 2) >> 0x20);
      bx_00.smallend.vect = (int  [3])*(undefined1 (*) [12])(pBVar37->domain).smallend.vect;
      bx_00.bigend.vect[1] = auVar59._0_4_;
      bx_00.bigend.vect[2] = auVar59._4_4_;
      bx_00.btype.itype = auVar59._8_4_;
      BaseFab<double>::copy<(amrex::RunOn)1>
                (pBVar37,&a_flux->_M_elems[lVar39]->super_BaseFab<double>,bx_00,(SrcComp)0x0,
                 (DestComp)0x0,(NumComps)pBVar37->nvar);
      local_148[lVar39] = (FArrayBox *)pBVar37;
      lVar39 = lVar39 + 1;
      pBVar37 = pBVar37 + 1;
    } while (lVar39 != 3);
  }
  local_1d0 = uVar15 >> 2 & 1;
  local_170 = CONCAT44(uVar15 >> 1,uVar15) & 0x100000001;
  local_1b0 = *(pointer *)
               &pVVar8[iVar17].super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                .super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>;
  local_1a0 = *(pointer *)
               ((long)&pVVar8[iVar17].
                       super_vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> +
               8);
  uVar45 = (ulong)uVar51;
  lVar39 = 0;
  do {
    local_210 = lVar39;
    local_240.smallend.vect[2] = local_270;
    local_240.smallend.vect[0] = local_278;
    local_240.smallend.vect[1] = uStack_274;
    local_280 = local_26c[2];
    local_288 = (double)CONCAT44(local_26c[1],local_26c[0]);
    iVar17 = local_240.smallend.vect[local_210] + -1;
    local_240.smallend.vect[local_210] = iVar17;
    iVar14 = local_240.smallend.vect[2];
    *(int *)((long)&local_288 + local_210 * 4) = iVar17;
    uVar47 = local_280;
    iVar12 = local_240.smallend.vect[0];
    local_200 = (long)local_240.smallend.vect[0];
    iVar13 = local_240.smallend.vect[1];
    local_208 = (long)local_240.smallend.vect[1];
    local_1f8 = (double *)(long)local_240.smallend.vect[2];
    iVar17 = (int)local_288;
    local_1b4 = (int)local_288;
    iVar11 = local_288._4_4_;
    local_1b8 = local_288._4_4_;
    local_1bc = local_280;
    local_240.smallend.vect[2] = local_270;
    local_280 = local_26c[2];
    local_288 = (double)CONCAT44(local_26c[1],local_26c[0]);
    local_158 = local_170;
    local_150 = local_1d0;
    iVar25 = (~*(uint *)((long)&local_158 + local_210 * 4) & 1) +
             *(int *)((long)&local_288 + local_210 * 4);
    local_240.smallend.vect[0] = local_278;
    local_240.smallend.vect[1] = uStack_274;
    local_240.smallend.vect[local_210] = iVar25;
    *(int *)((long)&local_288 + local_210 * 4) = iVar25;
    if (local_1b0 != local_1a0) {
      local_1e0 = (long)local_240.smallend.vect[0];
      local_1e8 = (long)local_240.smallend.vect[1];
      local_1f0 = (double *)(long)local_240.smallend.vect[2];
      local_1c0 = (int)local_288;
      local_1c4 = local_288._4_4_;
      local_1c8 = local_280;
      local_1a8 = local_148[local_210];
      uVar18 = (uint)local_210;
      local_220 = local_224 & ~(1 << (uVar18 & 0x1f));
      local_1cc = uVar18 * 2 + 1;
      ppFVar16 = local_1b0;
      do {
        local_168 = ppFVar16;
        local_198 = *local_168;
        iVar25 = (local_198->super_BaseFab<double>).domain.smallend.vect[0];
        lVar39 = (long)iVar25;
        iVar36 = iVar25;
        if (iVar25 < iVar12) {
          iVar36 = iVar12;
        }
        iVar26 = *(int *)((long)&(local_198->super_BaseFab<double>).domain + 4);
        lVar27 = (long)iVar26;
        iVar55 = iVar26;
        if (iVar26 < iVar13) {
          iVar55 = iVar13;
        }
        uVar4 = *(int *)((long)&(local_198->super_BaseFab<double>).domain + 8);
        pdVar28 = (double *)(long)(int)uVar4;
        uVar56 = uVar4;
        if ((int)uVar4 < iVar14) {
          uVar56 = iVar14;
        }
        local_21c = ((IntVect *)((long)&(local_198->super_BaseFab<double>).domain + 0xc))->vect[0];
        local_214 = *(int *)((long)&(local_198->super_BaseFab<double>).domain + 0x10);
        iVar48 = local_21c;
        if (iVar17 < local_21c) {
          iVar48 = iVar17;
        }
        iVar33 = local_214;
        if (iVar11 < local_214) {
          iVar33 = iVar11;
        }
        local_218 = *(int *)((long)&(local_198->super_BaseFab<double>).domain + 0x14);
        uVar32 = local_218;
        if ((int)uVar47 < (int)local_218) {
          uVar32 = uVar47;
        }
        if (((iVar36 <= iVar48) && (iVar55 <= iVar33)) &&
           (((int)uVar56 <= (int)uVar32 && (local_220 < 8)))) {
          pdVar41 = (local_198->super_BaseFab<double>).dptr;
          lVar29 = (long)((local_21c - iVar25) + 1);
          lVar34 = ((local_214 - iVar26) + 1) * lVar29;
          local_250 = (int)((local_218 - uVar4) + 1) * lVar34;
          dVar9 = *(double *)(local_128 + local_210 * 8);
          pdVar43 = (local_1a8->super_BaseFab<double>).dptr;
          iVar5 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[0];
          iVar6 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[1];
          iVar7 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[2];
          lVar49 = (long)(((local_1a8->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
          lVar46 = (((local_1a8->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1) * lVar49
          ;
          lVar21 = (((local_1a8->super_BaseFab<double>).domain.bigend.vect[2] - iVar7) + 1) * lVar46
          ;
          if (uVar18 == 0) {
            if (0 < (int)N) {
              local_248 = pdVar41 + (iVar36 - iVar25);
              lVar42 = local_208;
              if (local_208 < lVar27) {
                lVar42 = lVar27;
              }
              local_1d8 = local_1f8;
              if ((long)local_1f8 < (long)pdVar28) {
                local_1d8 = pdVar28;
              }
              local_160 = pdVar43 + (int)((iVar36 + 1) * uVar2 - iVar5);
              uVar35 = 0;
              do {
                pdVar41 = local_1d8;
                do {
                  lVar22 = ((long)pdVar41 - (long)pdVar28) * lVar34;
                  lVar40 = lVar42;
                  iVar36 = uVar3 * (int)lVar42 - iVar6;
                  do {
                    if (0 < (int)uVar51) {
                      lVar50 = (lVar40 - lVar27) * lVar29;
                      uVar23 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          dVar57 = local_248[local_250 * uVar35 + lVar22 + lVar50];
                          uVar30 = uVar44;
                          iVar48 = iVar36;
                          do {
                            dVar57 = dVar57 - local_160[lVar21 * uVar35 +
                                                        (int)((uVar51 * (int)pdVar41 - iVar7) +
                                                             (int)uVar23) * lVar46 + iVar48 * lVar49
                                                       ] * dVar9;
                            local_248[local_250 * uVar35 + lVar22 + lVar50] = dVar57;
                            iVar48 = iVar48 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar45);
                    }
                    lVar40 = lVar40 + 1;
                    iVar36 = iVar36 + uVar3;
                  } while (((iVar33 + (int)lVar42) - iVar55) + 1 != (int)lVar40);
                  pdVar41 = (double *)((long)pdVar41 + 1);
                } while (((uVar32 + (int)local_1d8) - uVar56) + 1 != (int)pdVar41);
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar20);
            }
          }
          else if (uVar18 == 2) {
            if (0 < (int)N) {
              lVar34 = lVar34 * (int)(uVar56 - uVar4);
              lVar42 = local_200;
              if (local_200 < lVar39) {
                lVar42 = lVar39;
              }
              lVar40 = local_208;
              if (local_208 < lVar27) {
                lVar40 = lVar27;
              }
              uVar35 = 0;
              do {
                lVar22 = lVar40;
                do {
                  lVar24 = (lVar22 - lVar27) * lVar29;
                  lVar50 = lVar42;
                  iVar52 = uVar2 * (int)lVar42 - iVar5;
                  do {
                    if (0 < (int)uVar3) {
                      uVar23 = 0;
                      do {
                        if (0 < (int)uVar2) {
                          dVar57 = pdVar41[lVar34 + local_250 * uVar35 + lVar24 + (lVar50 - lVar39)]
                          ;
                          uVar30 = uVar54;
                          iVar53 = iVar52;
                          do {
                            dVar57 = dVar57 - pdVar43[lVar46 * (int)((uVar56 + 1) * uVar51 - iVar7)
                                                      + lVar21 * uVar35 +
                                                        (int)(((int)lVar22 * uVar3 - iVar6) +
                                                             (int)uVar23) * lVar49 + (long)iVar53] *
                                              dVar9;
                            pdVar41[lVar34 + local_250 * uVar35 + lVar24 + (lVar50 - lVar39)] =
                                 dVar57;
                            iVar53 = iVar53 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar44);
                    }
                    lVar50 = lVar50 + 1;
                    iVar52 = iVar52 + uVar2;
                  } while (((iVar48 + (int)lVar42) - iVar36) + 1 != (int)lVar50);
                  lVar22 = lVar22 + 1;
                } while (((iVar33 + (int)lVar40) - iVar55) + 1 != (int)lVar22);
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar20);
            }
          }
          else if (uVar18 == 1) {
            if (0 < (int)N) {
              lVar29 = lVar29 * (iVar55 - iVar26);
              lVar42 = local_200;
              if (local_200 < lVar39) {
                lVar42 = lVar39;
              }
              pdVar31 = local_1f8;
              if ((long)local_1f8 < (long)pdVar28) {
                pdVar31 = pdVar28;
              }
              uVar35 = 0;
              do {
                pdVar38 = pdVar31;
                do {
                  lVar22 = ((long)pdVar38 - (long)pdVar28) * lVar34;
                  lVar40 = lVar42;
                  iVar33 = uVar2 * (int)lVar42 - iVar5;
                  do {
                    if (0 < (int)uVar51) {
                      uVar23 = 0;
                      do {
                        if (0 < (int)uVar2) {
                          dVar57 = pdVar41[lVar29 + local_250 * uVar35 + lVar22 + (lVar40 - lVar39)]
                          ;
                          uVar30 = uVar54;
                          iVar52 = iVar33;
                          do {
                            dVar57 = dVar57 - pdVar43[lVar49 * (int)((iVar55 + 1) * uVar3 - iVar6) +
                                                      lVar21 * uVar35 +
                                                      (int)((uVar51 * (int)pdVar38 - iVar7) +
                                                           (int)uVar23) * lVar46 + (long)iVar52] *
                                              dVar9;
                            pdVar41[lVar29 + local_250 * uVar35 + lVar22 + (lVar40 - lVar39)] =
                                 dVar57;
                            iVar52 = iVar52 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar45);
                    }
                    lVar40 = lVar40 + 1;
                    iVar33 = iVar33 + uVar2;
                  } while (((iVar48 + (int)lVar42) - iVar36) + 1 != (int)lVar40);
                  pdVar38 = (double *)((long)pdVar38 + 1);
                } while (((uVar32 + (int)pdVar31) - uVar56) + 1 != (int)pdVar38);
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar20);
            }
          }
          else if (0 < (int)N) {
            lVar34 = lVar34 * (int)(uVar56 - uVar4);
            lVar42 = local_200;
            if (local_200 < lVar39) {
              lVar42 = lVar39;
            }
            lVar40 = local_208;
            if (local_208 < lVar27) {
              lVar40 = lVar27;
            }
            uVar35 = 0;
            do {
              lVar22 = lVar40;
              do {
                lVar24 = (lVar22 - lVar27) * lVar29;
                lVar50 = lVar42;
                iVar52 = uVar2 * (int)lVar42 - iVar5;
                do {
                  if (0 < (int)uVar3) {
                    uVar23 = 0;
                    do {
                      if (0 < (int)uVar2) {
                        dVar57 = pdVar41[lVar34 + local_250 * uVar35 + lVar24 + (lVar50 - lVar39)];
                        uVar30 = uVar54;
                        iVar53 = iVar52;
                        do {
                          dVar57 = dVar57 + pdVar43[lVar46 * (int)(uVar56 * uVar51 - iVar7) +
                                                    lVar21 * uVar35 +
                                                    (int)(((int)lVar22 * uVar3 - iVar6) +
                                                         (int)uVar23) * lVar49 + (long)iVar53] *
                                            dVar9;
                          pdVar41[lVar34 + local_250 * uVar35 + lVar24 + (lVar50 - lVar39)] = dVar57
                          ;
                          iVar53 = iVar53 + 1;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar44);
                  }
                  lVar50 = lVar50 + 1;
                  iVar52 = iVar52 + uVar2;
                } while (((iVar48 + (int)lVar42) - iVar36) + 1 != (int)lVar50);
                lVar22 = lVar22 + 1;
              } while (((iVar33 + (int)lVar40) - iVar55) + 1 != (int)lVar22);
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar20);
          }
        }
        iVar36 = iVar25;
        if (iVar25 < local_240.smallend.vect[0]) {
          iVar36 = local_240.smallend.vect[0];
        }
        iVar55 = iVar26;
        if (iVar26 < local_240.smallend.vect[1]) {
          iVar55 = local_240.smallend.vect[1];
        }
        uVar56 = uVar4;
        if ((int)uVar4 < local_240.smallend.vect[2]) {
          uVar56 = local_240.smallend.vect[2];
        }
        iVar48 = local_21c;
        if ((int)local_288 < local_21c) {
          iVar48 = (int)local_288;
        }
        iVar33 = local_214;
        if (local_288._4_4_ < local_214) {
          iVar33 = local_288._4_4_;
        }
        uVar32 = local_218;
        if ((int)local_280 < (int)local_218) {
          uVar32 = local_280;
        }
        if ((((iVar36 <= iVar48) && (iVar55 <= iVar33)) && ((int)uVar56 <= (int)uVar32)) &&
           (local_220 < 8)) {
          pdVar41 = (local_198->super_BaseFab<double>).dptr;
          lVar21 = (long)((local_21c - iVar25) + 1);
          lVar34 = ((local_214 - iVar26) + 1) * lVar21;
          lVar29 = (int)((local_218 - uVar4) + 1) * lVar34;
          dVar9 = *(double *)(local_128 + local_210 * 8);
          pdVar43 = (local_1a8->super_BaseFab<double>).dptr;
          iVar5 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[0];
          iVar6 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[1];
          iVar7 = (local_1a8->super_BaseFab<double>).domain.smallend.vect[2];
          local_248 = (double *)CONCAT44(local_248._4_4_,iVar5);
          lVar49 = (long)(((local_1a8->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
          lVar46 = (((local_1a8->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1) * lVar49
          ;
          local_250 = (((local_1a8->super_BaseFab<double>).domain.bigend.vect[2] - iVar7) + 1) *
                      lVar46;
          if (local_1cc == 3) {
            if (0 < (int)N) {
              lVar21 = lVar21 * (iVar55 - iVar26);
              lVar27 = lVar39;
              if (lVar39 <= local_1e0) {
                lVar27 = local_1e0;
              }
              pdVar31 = pdVar28;
              if ((long)pdVar28 <= (long)local_1f0) {
                pdVar31 = local_1f0;
              }
              uVar35 = 0;
              do {
                pdVar38 = pdVar31;
                do {
                  lVar40 = ((long)pdVar38 - (long)pdVar28) * lVar34;
                  lVar42 = lVar27;
                  iVar25 = uVar2 * (int)lVar27 - iVar5;
                  do {
                    if (0 < (int)uVar51) {
                      uVar23 = 0;
                      do {
                        if (0 < (int)uVar2) {
                          dVar57 = pdVar41[lVar21 + lVar29 * uVar35 + lVar40 + (lVar42 - lVar39)];
                          uVar30 = uVar54;
                          iVar26 = iVar25;
                          do {
                            dVar57 = dVar57 + pdVar43[lVar49 * (int)(iVar55 * uVar3 - iVar6) +
                                                      local_250 * uVar35 +
                                                      (int)((uVar51 * (int)pdVar38 - iVar7) +
                                                           (int)uVar23) * lVar46 + (long)iVar26] *
                                              dVar9;
                            pdVar41[lVar21 + lVar29 * uVar35 + lVar40 + (lVar42 - lVar39)] = dVar57;
                            iVar26 = iVar26 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar45);
                    }
                    lVar42 = lVar42 + 1;
                    iVar25 = iVar25 + uVar2;
                  } while (((iVar48 + (int)lVar27) - iVar36) + 1 != (int)lVar42);
                  pdVar38 = (double *)((long)pdVar38 + 1);
                } while (((uVar32 + (int)pdVar31) - uVar56) + 1 != (int)pdVar38);
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar20);
            }
          }
          else if (local_1cc == 1) {
            if (0 < (int)N) {
              lVar39 = local_1e8;
              if (local_1e8 < lVar27) {
                lVar39 = lVar27;
              }
              local_248 = local_1f0;
              if ((long)local_1f0 < (long)pdVar28) {
                local_248 = pdVar28;
              }
              local_1d8 = pdVar43 + (int)(iVar36 * uVar2 - iVar5);
              uVar35 = 0;
              do {
                pdVar43 = local_248;
                do {
                  lVar40 = ((long)pdVar43 - (long)pdVar28) * lVar34;
                  lVar42 = lVar39;
                  iVar26 = uVar3 * (int)lVar39 - iVar6;
                  do {
                    if (0 < (int)uVar51) {
                      lVar22 = (lVar42 - lVar27) * lVar21;
                      uVar23 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          dVar57 = pdVar41[(long)(iVar36 - iVar25) +
                                           lVar29 * uVar35 + lVar40 + lVar22];
                          uVar30 = uVar44;
                          iVar48 = iVar26;
                          do {
                            dVar57 = dVar57 + local_1d8[local_250 * uVar35 +
                                                        (int)((uVar51 * (int)pdVar43 - iVar7) +
                                                             (int)uVar23) * lVar46 + iVar48 * lVar49
                                                       ] * dVar9;
                            pdVar41[(long)(iVar36 - iVar25) + lVar29 * uVar35 + lVar40 + lVar22] =
                                 dVar57;
                            iVar48 = iVar48 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar45);
                    }
                    lVar42 = lVar42 + 1;
                    iVar26 = iVar26 + uVar3;
                  } while (((iVar33 + (int)lVar39) - iVar55) + 1 != (int)lVar42);
                  pdVar43 = (double *)((long)pdVar43 + 1);
                } while (((uVar32 + (int)local_248) - uVar56) + 1 != (int)pdVar43);
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar20);
            }
          }
          else if (0 < (int)N) {
            lVar34 = lVar34 * (int)(uVar56 - uVar4);
            lVar42 = lVar39;
            if (lVar39 <= local_1e0) {
              lVar42 = local_1e0;
            }
            lVar40 = lVar27;
            if (lVar27 <= local_1e8) {
              lVar40 = local_1e8;
            }
            uVar35 = 0;
            do {
              lVar22 = lVar40;
              do {
                lVar24 = (lVar22 - lVar27) * lVar21;
                lVar50 = lVar42;
                iVar25 = uVar2 * (int)lVar42 - iVar5;
                do {
                  if (0 < (int)uVar3) {
                    uVar23 = 0;
                    do {
                      if (0 < (int)uVar2) {
                        dVar57 = pdVar41[lVar34 + lVar29 * uVar35 + lVar24 + (lVar50 - lVar39)];
                        uVar30 = uVar54;
                        iVar26 = iVar25;
                        do {
                          dVar57 = dVar57 + pdVar43[lVar46 * (int)(uVar56 * uVar51 - iVar7) +
                                                    local_250 * uVar35 +
                                                    (int)(((int)lVar22 * uVar3 - iVar6) +
                                                         (int)uVar23) * lVar49 + (long)iVar26] *
                                            dVar9;
                          pdVar41[lVar34 + lVar29 * uVar35 + lVar24 + (lVar50 - lVar39)] = dVar57;
                          iVar26 = iVar26 + 1;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar44);
                  }
                  lVar50 = lVar50 + 1;
                  iVar25 = iVar25 + uVar2;
                } while (((iVar48 + (int)lVar42) - iVar36) + 1 != (int)lVar50);
                lVar22 = lVar22 + 1;
              } while (((iVar33 + (int)lVar40) - iVar55) + 1 != (int)lVar22);
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar20);
          }
        }
        ppFVar16 = local_168 + 1;
      } while (local_168 + 1 != local_1a0);
    }
    lVar39 = local_210 + 1;
  } while (local_210 + 1 != 3);
  lVar39 = 0x90;
  do {
    pBVar37 = (BaseFab<double> *)((long)(&local_108[0].domain.smallend + -2) + lVar39);
    pBVar37->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
    BaseFab<double>::clear(pBVar37);
    lVar39 = lVar39 + -0x48;
  } while (lVar39 != -0x48);
  return;
}

Assistant:

void
YAFluxRegister::FineAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& a_flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_cfpatch.nComp() == a_flux[0]->nComp());

    const int li = mfi.LocalIndex();
    Vector<FArrayBox*>& cfp_fabs = m_cfp_fab[li];
    if (cfp_fabs.empty()) return;

    const Box& tbx = mfi.tilebox();
    const Box& bx = amrex::coarsen(tbx, m_ratio);
    const Box& fbx = amrex::refine(bx, m_ratio);
    const int nc = m_cfpatch.nComp();

    const Real ratio = static_cast<Real>(AMREX_D_TERM(m_ratio[0],*m_ratio[1],*m_ratio[2]));
    std::array<Real,AMREX_SPACEDIM> dtdx{{AMREX_D_DECL(dt/(dx[0]*ratio),
                                                       dt/(dx[1]*ratio),
                                                       dt/(dx[2]*ratio))}};
    const Dim3 rr = m_ratio.dim3();

    std::array<FArrayBox const*,AMREX_SPACEDIM> flux{{AMREX_D_DECL(a_flux[0],a_flux[1],a_flux[2])}};
    bool use_gpu = (runon == RunOn::Gpu) && Gpu::inLaunchRegion();
    amrex::ignore_unused(use_gpu);
    std::array<FArrayBox,AMREX_SPACEDIM> ftmp;
    if (fbx != tbx) {
        AMREX_ASSERT(!use_gpu);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            const Box& b = amrex::surroundingNodes(fbx,idim);
            ftmp[idim].resize(b,nc);
            ftmp[idim].setVal<RunOn::Host>(0.0);
            ftmp[idim].copy<RunOn::Host>(*a_flux[idim]);
            flux[idim] = &ftmp[idim];
        }
    }

    AMREX_ASSERT(bx.cellCentered());

    for (int idim=0; idim < AMREX_SPACEDIM; ++idim)
    {
        const Box& lobx = amrex::adjCellLo(bx, idim);
        const Box& hibx = amrex::adjCellHi(bx, idim);
        FArrayBox const* f = flux[idim];
        for (FArrayBox* cfp : cfp_fabs)
        {
            {
                const Box& lobx_is = lobx & cfp->box();
                const int side = 0;
                if (lobx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, lobx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
            {
                const Box& hibx_is = hibx & cfp->box();
                const int side = 1;
                if (hibx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, hibx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
        }
    }
}